

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitview.h
# Opt level: O2

void __thiscall
bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>::insert
          (bitview<bv::internal::bitarray_t<4096UL>::array> *this,size_t index,bool bit)

{
  ulong uVar1;
  sbyte sVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  byte bVar5;
  
  uVar4 = index >> 6;
  uVar3 = (this->_container)._M_elems[uVar4];
  bVar5 = (byte)index & 0x3f;
  sVar2 = (bVar5 < 0x41) * ('@' - bVar5);
  (this->_container)._M_elems[uVar4] =
       (CONCAT71(in_register_00000011,bit) & 0xffffffff) << (index & 0x3f) |
       (uVar3 << sVar2) >> sVar2 | (-1L << (index & 0x3f) & uVar3) * 2;
  for (; uVar4 < 0x3f; uVar4 = uVar4 + 1) {
    uVar1 = (this->_container)._M_elems[uVar4 + 1];
    (this->_container)._M_elems[uVar4 + 1] = uVar3 >> 0x3f | uVar1 << 1;
    uVar3 = uVar1;
  }
  return;
}

Assistant:

void bitview<Container>::insert(size_t index, bool bit)
        {
            size_t i = index / W;
            size_t pos = index % W;

            word_type word = _container[i];
            word_type mask = word_type(-1) << pos;

            word_type carry = word >> (W - 1);
            _container[i] = ((word &  mask) << 1)    | 
                             (word & ~mask)          | 
                             (word_type(bit) << pos);

            for(size_t j = i + 1; j < _container.size(); ++j) 
            {
                word = _container[j];
                word_type newcarry = word >> (W - 1);
                
                _container[j] = word << 1 | carry;
                carry = newcarry;
            }
        }